

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

void dukglue_read<std::vector<int,std::allocator<int>>>
               (duk_context *ctx,duk_idx_t arg_idx,vector<int,_std::allocator<int>_> *out)

{
  duk_idx_t in_ECX;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *out_local;
  duk_context *pdStack_10;
  duk_idx_t arg_idx_local;
  duk_context *ctx_local;
  
  local_20 = out;
  out_local._4_4_ = arg_idx;
  pdStack_10 = ctx;
  dukglue::types::DukType<std::vector<int,std::allocator<int>>>::
  read<std::vector<int,std::allocator<int>>>
            (&local_38,(DukType<std::vector<int,std::allocator<int>>> *)ctx,
             (duk_context *)(ulong)(uint)arg_idx,in_ECX);
  std::vector<int,_std::allocator<int>_>::operator=(local_20,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  return;
}

Assistant:

void dukglue_read(duk_context* ctx, duk_idx_t arg_idx, RetT* out)
{
	// ArgStorage has some static_asserts in it that validate value types,
	// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
	typedef typename dukglue::types::ArgStorage<RetT>::type ValidateReturnType;

	using namespace dukglue::types;
	*out = DukType<typename Bare<RetT>::type>::template read<RetT>(ctx, arg_idx);
}